

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryLambdaWrapper,bool,duckdb::dtime_tz_t(*)(duckdb::interval_t,duckdb::dtime_tz_t),false,true>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,_func_dtime_tz_t_interval_t_dtime_tz_t *fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  dtime_tz_t dVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int64_t *piVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  interval_t iVar17;
  interval_t iVar18;
  interval_t iVar19;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar13 = &ldata->micros;
    for (iVar16 = 0; count != iVar16; iVar16 = iVar16 + 1) {
      uVar3 = ((interval_t *)(piVar13 + -1))->months;
      uVar8 = ((interval_t *)(piVar13 + -1))->days;
      iVar19.days = uVar8;
      iVar19.months = uVar3;
      iVar19.micros = *piVar13;
      dVar9 = (*fun)(iVar19,rdata->bits);
      result_data[iVar16].bits = dVar9.bits;
      piVar13 = piVar13 + 2;
    }
  }
  else {
    uVar15 = 0;
    for (uVar11 = 0; uVar11 != count + 0x3f >> 6; uVar11 = uVar11 + 1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar14 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar14 = count;
        }
LAB_00cb533b:
        piVar13 = &ldata[uVar15].micros;
        for (; uVar10 = uVar15, uVar15 < uVar14; uVar15 = uVar15 + 1) {
          uVar1 = ((interval_t *)(piVar13 + -1))->months;
          uVar6 = ((interval_t *)(piVar13 + -1))->days;
          iVar17.days = uVar6;
          iVar17.months = uVar1;
          iVar17.micros = *piVar13;
          dVar9 = (*fun)(iVar17,rdata->bits);
          result_data[uVar15].bits = dVar9.bits;
          piVar13 = piVar13 + 2;
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar14 = uVar15 + 0x40;
        if (count <= uVar15 + 0x40) {
          uVar14 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_00cb533b;
        uVar10 = uVar14;
        if (uVar5 != 0) {
          piVar13 = &ldata[uVar15].micros;
          for (uVar12 = 0; uVar10 = uVar15 + uVar12, uVar15 + uVar12 < uVar14; uVar12 = uVar12 + 1)
          {
            if ((uVar5 >> (uVar12 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar13 + -1))->months;
              uVar7 = ((interval_t *)(piVar13 + -1))->days;
              iVar18.days = uVar7;
              iVar18.months = uVar2;
              iVar18.micros = *piVar13;
              dVar9 = (*fun)(iVar18,rdata->bits);
              result_data[uVar15 + uVar12].bits = dVar9.bits;
            }
            piVar13 = piVar13 + 2;
          }
        }
      }
      uVar15 = uVar10;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}